

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O3

OPJ_BOOL opj_t2_read_packet_header
                   (opj_t2_t *p_t2,opj_tcd_tile_t *p_tile,opj_tcp_t *p_tcp,opj_pi_iterator_t *p_pi,
                   OPJ_BOOL *p_is_data_present,OPJ_BYTE *p_src_data,OPJ_UINT32 *p_data_read,
                   OPJ_UINT32 p_max_length,opj_packet_info_t *p_pack_info,opj_event_mgr_t *p_manager
                   )

{
  opj_tcd_seg_t *poVar1;
  OPJ_BOOL OVar2;
  int iVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  uint uVar7;
  opj_bio_t *bio;
  ptrdiff_t pVar8;
  OPJ_UINT32 *pOVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  OPJ_UINT32 i;
  opj_tcd_band_t *poVar13;
  long lVar14;
  opj_t2_t *poVar15;
  ulong uVar16;
  uint uVar17;
  opj_cp_t *poVar18;
  opj_tcd_precinct_t *poVar19;
  opj_tcd_cblk_dec_t *cblk;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 l_remaining_length;
  opj_cp_t **local_98;
  int local_80;
  opj_cp_t *local_70;
  OPJ_UINT32 local_68;
  uint local_64;
  opj_t2_t *local_60;
  opj_tcd_precinct_t *local_58;
  long local_50;
  opj_cp_t *local_48;
  opj_tcd_band_t *local_40;
  int local_34;
  
  lVar14 = (ulong)p_pi->resno * 0xc0 + (long)p_tile->distolayer[(ulong)p_pi->compno * 0xe + -2];
  local_70 = (opj_cp_t *)p_src_data;
  if ((p_pi->layno == 0) && (*(int *)(lVar14 + 0x18) != 0)) {
    poVar13 = (opj_tcd_band_t *)(lVar14 + 0x20);
    uVar17 = 0;
    do {
      OVar2 = opj_tcd_is_band_empty(poVar13);
      if (OVar2 == 0) {
        uVar7 = p_pi->precno;
        if (poVar13->precincts_data_size / 0x38 <= uVar7) {
          opj_event_msg((opj_event_mgr_t *)p_pack_info,1,"Invalid precinct\n");
          return 0;
        }
        poVar19 = poVar13->precincts;
        opj_tgt_reset(poVar19[uVar7].incltree);
        opj_tgt_reset(poVar19[uVar7].imsbtree);
        iVar3 = poVar19[uVar7].ch * poVar19[uVar7].cw;
        if (iVar3 != 0) {
          pOVar9 = &(poVar19[uVar7].cblks.enc)->numpasses;
          do {
            *(undefined8 *)(pOVar9 + -1) = 0;
            pOVar9 = pOVar9 + 0x14;
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
      }
      poVar13 = poVar13 + 1;
      uVar17 = uVar17 + 1;
    } while (uVar17 < *(uint *)(lVar14 + 0x18));
  }
  poVar18 = (opj_cp_t *)p_src_data;
  if ((p_tcp->csty & 2) != 0) {
    if (p_max_length < 6) {
      pcVar10 = "Not enough space for expected SOP marker\n";
    }
    else {
      if ((*p_src_data == 0xff) && (p_src_data[1] == 0x91)) {
        poVar18 = (opj_cp_t *)(p_src_data + 6);
        local_70 = poVar18;
        goto LAB_0014046c;
      }
      pcVar10 = "Expected SOP marker\n";
    }
    opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar10);
  }
LAB_0014046c:
  bio = opj_bio_create();
  if (bio == (opj_bio_t *)0x0) {
    return 0;
  }
  local_80 = (int)p_src_data;
  if (((ulong)p_t2[9].cp & 0x100000000) == 0) {
    if ((p_tcp->field_0x1638 & 2) == 0) {
      poVar15 = (opj_t2_t *)&local_34;
      local_34 = (p_max_length + local_80) - (int)poVar18;
      local_98 = &local_70;
    }
    else {
      local_98 = (opj_cp_t **)&p_tcp->ppt_data;
      poVar18 = (opj_cp_t *)p_tcp->ppt_data;
      poVar15 = (opj_t2_t *)&p_tcp->ppt_len;
    }
  }
  else {
    local_98 = &p_t2[3].cp;
    poVar18 = p_t2[3].cp;
    poVar15 = p_t2 + 4;
  }
  opj_bio_init_dec(bio,(OPJ_BYTE *)poVar18,*(OPJ_UINT32 *)&poVar15->image);
  OVar4 = opj_bio_read(bio,1);
  if (OVar4 != 0) {
    local_60 = poVar15;
    local_48 = poVar18;
    if (*(int *)(lVar14 + 0x18) != 0) {
      poVar13 = (opj_tcd_band_t *)(lVar14 + 0x20);
      uVar17 = 0;
      do {
        poVar19 = poVar13->precincts + p_pi->precno;
        local_64 = uVar17;
        OVar2 = opj_tcd_is_band_empty(poVar13);
        if ((OVar2 == 0) && (local_68 = poVar19->ch * poVar19->cw, local_68 != 0)) {
          cblk = (poVar19->cblks).dec;
          OVar4 = 0;
          local_58 = poVar19;
          local_40 = poVar13;
          do {
            poVar13 = local_40;
            if (cblk->numsegs == 0) {
              OVar5 = opj_tgt_decode(bio,local_58->incltree,OVar4,p_pi->layno + 1);
            }
            else {
              OVar5 = opj_bio_read(bio,1);
            }
            poVar19 = local_58;
            if (OVar5 == 0) {
              cblk->numnewpasses = 0;
            }
            else {
              if (cblk->numsegs == 0) {
                iVar3 = 0;
                local_50 = lVar14;
                do {
                  OVar5 = opj_tgt_decode(bio,poVar19->imsbtree,OVar4,iVar3);
                  iVar3 = iVar3 + 1;
                } while (OVar5 == 0);
                OVar5 = poVar13->numbps;
                cblk->Mb = OVar5;
                cblk->numbps = (OVar5 - iVar3) + 2;
                cblk->numlenbits = 3;
                lVar14 = local_50;
              }
              OVar6 = 1;
              OVar5 = opj_bio_read(bio,1);
              if (OVar5 != 0) {
                OVar5 = opj_bio_read(bio,1);
                if (OVar5 == 0) {
                  OVar6 = 2;
                }
                else {
                  OVar6 = opj_bio_read(bio,2);
                  if (OVar6 == 3) {
                    OVar6 = opj_bio_read(bio,5);
                    if (OVar6 == 0x1f) {
                      OVar6 = opj_bio_read(bio,7);
                      OVar6 = OVar6 + 0x25;
                    }
                    else {
                      OVar6 = OVar6 + 6;
                    }
                  }
                  else {
                    OVar6 = OVar6 + 3;
                  }
                }
              }
              cblk->numnewpasses = OVar6;
              iVar3 = -1;
              do {
                OVar5 = opj_bio_read(bio,1);
                iVar3 = iVar3 + 1;
              } while (OVar5 != 0);
              cblk->numlenbits = cblk->numlenbits + iVar3;
              uVar17 = cblk->numsegs;
              if (uVar17 == 0) {
                uVar16 = 0;
                iVar3 = opj_t2_init_seg(cblk,0,p_tcp->tccps[p_pi->compno].cblksty,1);
LAB_00140757:
                if (iVar3 == 0) goto LAB_0014097b;
              }
              else {
                uVar16 = (ulong)(uVar17 - 1);
                if (cblk->segs[uVar16].numpasses == cblk->segs[uVar16].maxpasses) {
                  iVar3 = opj_t2_init_seg(cblk,uVar17,p_tcp->tccps[p_pi->compno].cblksty,0);
                  uVar16 = (ulong)uVar17;
                  goto LAB_00140757;
                }
              }
              uVar17 = cblk->numnewpasses;
              if ((p_tcp->tccps[p_pi->compno].cblksty & 0x40) == 0) {
                while( true ) {
                  poVar1 = cblk->segs;
                  uVar7 = poVar1[uVar16].maxpasses - poVar1[uVar16].numpasses;
                  if ((int)uVar17 <= (int)uVar7) {
                    uVar7 = uVar17;
                  }
                  poVar1[uVar16].numnewpasses = uVar7;
                  iVar3 = 0;
                  if (1 < uVar7) {
                    iVar3 = 0;
                    uVar11 = (ulong)uVar7;
                    do {
                      iVar3 = iVar3 + 1;
                      uVar7 = (uint)uVar11;
                      uVar11 = uVar11 >> 1;
                    } while (3 < uVar7);
                  }
                  uVar7 = iVar3 + cblk->numlenbits;
                  if (0x20 < uVar7) goto LAB_00140960;
                  OVar5 = opj_bio_read(bio,uVar7);
                  poVar1 = cblk->segs;
                  poVar1[uVar16].newlen = OVar5;
                  OVar5 = poVar1[uVar16].numnewpasses;
                  uVar7 = uVar17 - OVar5;
                  if (uVar7 == 0 || (int)uVar17 < (int)OVar5) break;
                  uVar17 = (int)uVar16 + 1;
                  uVar16 = (ulong)uVar17;
                  OVar2 = opj_t2_init_seg(cblk,uVar17,p_tcp->tccps[p_pi->compno].cblksty,0);
                  uVar17 = uVar7;
                  if (OVar2 == 0) goto LAB_0014097b;
                }
              }
              else {
                while( true ) {
                  uVar7 = uVar17;
                  if ((int)uVar16 == 0) {
                    uVar7 = 1;
                  }
                  cblk->segs[uVar16].numnewpasses = uVar7;
                  iVar3 = 0;
                  if (1 < uVar7) {
                    iVar3 = 0;
                    uVar11 = (ulong)uVar17;
                    do {
                      iVar3 = iVar3 + 1;
                      uVar7 = (uint)uVar11;
                      uVar11 = uVar11 >> 1;
                    } while (3 < uVar7);
                  }
                  uVar7 = iVar3 + cblk->numlenbits;
                  if (0x20 < uVar7) goto LAB_00140960;
                  OVar5 = opj_bio_read(bio,uVar7);
                  poVar1 = cblk->segs;
                  poVar1[uVar16].newlen = OVar5;
                  OVar5 = poVar1[uVar16].numnewpasses;
                  uVar7 = uVar17 - OVar5;
                  if (uVar7 == 0 || (int)uVar17 < (int)OVar5) break;
                  uVar17 = (int)uVar16 + 1;
                  uVar16 = (ulong)uVar17;
                  OVar2 = opj_t2_init_seg(cblk,uVar17,p_tcp->tccps[p_pi->compno].cblksty,0);
                  uVar17 = uVar7;
                  if (OVar2 == 0) goto LAB_0014097b;
                }
              }
            }
            cblk = cblk + 1;
            OVar4 = OVar4 + 1;
            poVar13 = local_40;
          } while (OVar4 != local_68);
        }
        uVar17 = local_64 + 1;
        poVar13 = poVar13 + 1;
      } while (uVar17 < *(uint *)(lVar14 + 0x18));
    }
    OVar2 = opj_bio_inalign(bio);
    if (OVar2 == 0) {
LAB_0014097b:
      opj_bio_destroy(bio);
      return 0;
    }
    pVar8 = opj_bio_numbytes(bio);
    pcVar10 = (char *)((long)&local_48->rsiz + pVar8);
    opj_bio_destroy(bio);
    poVar15 = local_60;
    if ((p_tcp->csty & 4) != 0) {
      if ((*(int *)local_98 - (int)pcVar10) + *(OPJ_UINT32 *)&local_60->image < 2) {
        pcVar12 = "Not enough space for expected EPH marker\n";
      }
      else {
        if ((*pcVar10 == -1) && (pcVar10[1] == -0x6e)) {
          pcVar10 = pcVar10 + 2;
          goto LAB_00140a50;
        }
        pcVar12 = "Expected EPH marker\n";
      }
      opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar12);
    }
LAB_00140a50:
    poVar18 = *local_98;
    uVar17 = (int)pcVar10 - (int)poVar18;
    *(OPJ_UINT32 *)&poVar15->image = *(OPJ_UINT32 *)&poVar15->image - uVar17;
    *local_98 = (opj_cp_t *)((long)&poVar18->rsiz + (ulong)uVar17);
    *p_is_data_present = 1;
    *p_data_read = (int)local_70 - local_80;
    return 1;
  }
  opj_bio_inalign(bio);
  pVar8 = opj_bio_numbytes(bio);
  pcVar10 = (char *)((long)&poVar18->rsiz + pVar8);
  opj_bio_destroy(bio);
  if ((p_tcp->csty & 4) != 0) {
    if ((*(int *)local_98 - (int)pcVar10) + *(OPJ_UINT32 *)&poVar15->image < 2) {
      pcVar12 = "Not enough space for expected EPH marker\n";
    }
    else {
      if ((*pcVar10 == -1) && (pcVar10[1] == -0x6e)) {
        pcVar10 = pcVar10 + 2;
        goto LAB_001409fc;
      }
      pcVar12 = "Expected EPH marker\n";
    }
    opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar12);
  }
LAB_001409fc:
  poVar18 = *local_98;
  uVar17 = (int)pcVar10 - (int)poVar18;
  *(OPJ_UINT32 *)&poVar15->image = *(OPJ_UINT32 *)&poVar15->image - uVar17;
  *local_98 = (opj_cp_t *)((long)&poVar18->rsiz + (ulong)uVar17);
  *p_is_data_present = 0;
  *p_data_read = (int)local_70 - local_80;
  return 1;
LAB_00140960:
  opj_event_msg((opj_event_mgr_t *)p_pack_info,1,
                "Invalid bit number %d in opj_t2_read_packet_header()\n");
  goto LAB_0014097b;
}

Assistant:

static OPJ_BOOL opj_t2_read_packet_header(opj_t2_t* p_t2,
        opj_tcd_tile_t *p_tile,
        opj_tcp_t *p_tcp,
        opj_pi_iterator_t *p_pi,
        OPJ_BOOL * p_is_data_present,
        OPJ_BYTE *p_src_data,
        OPJ_UINT32 * p_data_read,
        OPJ_UINT32 p_max_length,
        opj_packet_info_t *p_pack_info,
        opj_event_mgr_t *p_manager)

{
    /* loop */
    OPJ_UINT32 bandno, cblkno;
    OPJ_UINT32 l_nb_code_blocks;
    OPJ_UINT32 l_remaining_length;
    OPJ_UINT32 l_header_length;
    OPJ_UINT32 * l_modified_length_ptr = 00;
    OPJ_BYTE *l_current_data = p_src_data;
    opj_cp_t *l_cp = p_t2->cp;
    opj_bio_t *l_bio = 00;  /* BIO component */
    opj_tcd_band_t *l_band = 00;
    opj_tcd_cblk_dec_t* l_cblk = 00;
    opj_tcd_resolution_t* l_res =
        &p_tile->comps[p_pi->compno].resolutions[p_pi->resno];

    OPJ_BYTE *l_header_data = 00;
    OPJ_BYTE **l_header_data_start = 00;

    OPJ_UINT32 l_present;

    if (p_pi->layno == 0) {
        l_band = l_res->bands;

        /* reset tagtrees */
        for (bandno = 0; bandno < l_res->numbands; ++bandno) {
            if (!opj_tcd_is_band_empty(l_band)) {
                opj_tcd_precinct_t *l_prc = &l_band->precincts[p_pi->precno];
                if (!(p_pi->precno < (l_band->precincts_data_size / sizeof(
                                          opj_tcd_precinct_t)))) {
                    opj_event_msg(p_manager, EVT_ERROR, "Invalid precinct\n");
                    return OPJ_FALSE;
                }


                opj_tgt_reset(l_prc->incltree);
                opj_tgt_reset(l_prc->imsbtree);
                l_cblk = l_prc->cblks.dec;

                l_nb_code_blocks = l_prc->cw * l_prc->ch;
                for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno) {
                    l_cblk->numsegs = 0;
                    l_cblk->real_num_segs = 0;
                    ++l_cblk;
                }
            }

            ++l_band;
        }
    }

    /* SOP markers */

    if (p_tcp->csty & J2K_CP_CSTY_SOP) {
        if (p_max_length < 6) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Not enough space for expected SOP marker\n");
        } else if ((*l_current_data) != 0xff || (*(l_current_data + 1) != 0x91)) {
            opj_event_msg(p_manager, EVT_WARNING, "Expected SOP marker\n");
        } else {
            l_current_data += 6;
        }

        /** TODO : check the Nsop value */
    }

    /*
    When the marker PPT/PPM is used the packet header are store in PPT/PPM marker
    This part deal with this characteristic
    step 1: Read packet header in the saved structure
    step 2: Return to codestream for decoding
    */

    l_bio = opj_bio_create();
    if (! l_bio) {
        return OPJ_FALSE;
    }

    if (l_cp->ppm == 1) { /* PPM */
        l_header_data_start = &l_cp->ppm_data;
        l_header_data = *l_header_data_start;
        l_modified_length_ptr = &(l_cp->ppm_len);

    } else if (p_tcp->ppt == 1) { /* PPT */
        l_header_data_start = &(p_tcp->ppt_data);
        l_header_data = *l_header_data_start;
        l_modified_length_ptr = &(p_tcp->ppt_len);
    } else { /* Normal Case */
        l_header_data_start = &(l_current_data);
        l_header_data = *l_header_data_start;
        l_remaining_length = (OPJ_UINT32)(p_src_data + p_max_length - l_header_data);
        l_modified_length_ptr = &(l_remaining_length);
    }

    opj_bio_init_dec(l_bio, l_header_data, *l_modified_length_ptr);

    l_present = opj_bio_read(l_bio, 1);
    JAS_FPRINTF(stderr, "present=%d \n", l_present);
    if (!l_present) {
        /* TODO MSD: no test to control the output of this function*/
        opj_bio_inalign(l_bio);
        l_header_data += opj_bio_numbytes(l_bio);
        opj_bio_destroy(l_bio);

        /* EPH markers */
        if (p_tcp->csty & J2K_CP_CSTY_EPH) {
            if ((*l_modified_length_ptr - (OPJ_UINT32)(l_header_data -
                    *l_header_data_start)) < 2U) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Not enough space for expected EPH marker\n");
            } else if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
                opj_event_msg(p_manager, EVT_WARNING, "Expected EPH marker\n");
            } else {
                l_header_data += 2;
            }
        }

        l_header_length = (OPJ_UINT32)(l_header_data - *l_header_data_start);
        *l_modified_length_ptr -= l_header_length;
        *l_header_data_start += l_header_length;

        /* << INDEX */
        /* End of packet header position. Currently only represents the distance to start of packet
           Will be updated later by incrementing with packet start value */
        if (p_pack_info) {
            p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
        }
        /* INDEX >> */

        * p_is_data_present = OPJ_FALSE;
        *p_data_read = (OPJ_UINT32)(l_current_data - p_src_data);
        return OPJ_TRUE;
    }

    l_band = l_res->bands;
    for (bandno = 0; bandno < l_res->numbands; ++bandno, ++l_band) {
        opj_tcd_precinct_t *l_prc = &(l_band->precincts[p_pi->precno]);

        if (opj_tcd_is_band_empty(l_band)) {
            continue;
        }

        l_nb_code_blocks = l_prc->cw * l_prc->ch;
        l_cblk = l_prc->cblks.dec;
        for (cblkno = 0; cblkno < l_nb_code_blocks; cblkno++) {
            OPJ_UINT32 l_included, l_increment, l_segno;
            OPJ_INT32 n;

            /* if cblk not yet included before --> inclusion tagtree */
            if (!l_cblk->numsegs) {
                l_included = opj_tgt_decode(l_bio, l_prc->incltree, cblkno,
                                            (OPJ_INT32)(p_pi->layno + 1));
                /* else one bit */
            } else {
                l_included = opj_bio_read(l_bio, 1);
            }

            /* if cblk not included */
            if (!l_included) {
                l_cblk->numnewpasses = 0;
                ++l_cblk;
                JAS_FPRINTF(stderr, "included=%d \n", l_included);
                continue;
            }

            /* if cblk not yet included --> zero-bitplane tagtree */
            if (!l_cblk->numsegs) {
                OPJ_UINT32 i = 0;

                while (!opj_tgt_decode(l_bio, l_prc->imsbtree, cblkno, (OPJ_INT32)i)) {
                    ++i;
                }

                l_cblk->Mb = (OPJ_UINT32)l_band->numbps;
                l_cblk->numbps = (OPJ_UINT32)l_band->numbps + 1 - i;
                l_cblk->numlenbits = 3;
            }

            /* number of coding passes */
            l_cblk->numnewpasses = opj_t2_getnumpasses(l_bio);
            l_increment = opj_t2_getcommacode(l_bio);

            /* length indicator increment */
            l_cblk->numlenbits += l_increment;
            l_segno = 0;

            if (!l_cblk->numsegs) {
                if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 1)) {
                    opj_bio_destroy(l_bio);
                    return OPJ_FALSE;
                }
            } else {
                l_segno = l_cblk->numsegs - 1;
                if (l_cblk->segs[l_segno].numpasses == l_cblk->segs[l_segno].maxpasses) {
                    ++l_segno;
                    if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                }
            }
            n = (OPJ_INT32)l_cblk->numnewpasses;

            if ((p_tcp->tccps[p_pi->compno].cblksty & J2K_CCP_CBLKSTY_HT) != 0)
                do {
                    OPJ_UINT32 bit_number;
                    l_cblk->segs[l_segno].numnewpasses = l_segno == 0 ? 1 : (OPJ_UINT32)n;
                    bit_number = l_cblk->numlenbits + opj_uint_floorlog2(
                                     l_cblk->segs[l_segno].numnewpasses);
                    if (bit_number > 32) {
                        opj_event_msg(p_manager, EVT_ERROR,
                                      "Invalid bit number %d in opj_t2_read_packet_header()\n",
                                      bit_number);
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                    l_cblk->segs[l_segno].newlen = opj_bio_read(l_bio, bit_number);
                    JAS_FPRINTF(stderr, "included=%d numnewpasses=%d increment=%d len=%d \n",
                                l_included, l_cblk->segs[l_segno].numnewpasses, l_increment,
                                l_cblk->segs[l_segno].newlen);

                    n -= (OPJ_INT32)l_cblk->segs[l_segno].numnewpasses;
                    if (n > 0) {
                        ++l_segno;

                        if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                            opj_bio_destroy(l_bio);
                            return OPJ_FALSE;
                        }
                    }
                } while (n > 0);
            else
                do {
                    OPJ_UINT32 bit_number;
                    l_cblk->segs[l_segno].numnewpasses = (OPJ_UINT32)opj_int_min((OPJ_INT32)(
                            l_cblk->segs[l_segno].maxpasses - l_cblk->segs[l_segno].numpasses), n);
                    bit_number = l_cblk->numlenbits + opj_uint_floorlog2(
                                     l_cblk->segs[l_segno].numnewpasses);
                    if (bit_number > 32) {
                        opj_event_msg(p_manager, EVT_ERROR,
                                      "Invalid bit number %d in opj_t2_read_packet_header()\n",
                                      bit_number);
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                    l_cblk->segs[l_segno].newlen = opj_bio_read(l_bio, bit_number);
                    JAS_FPRINTF(stderr, "included=%d numnewpasses=%d increment=%d len=%d \n",
                                l_included, l_cblk->segs[l_segno].numnewpasses, l_increment,
                                l_cblk->segs[l_segno].newlen);

                    n -= (OPJ_INT32)l_cblk->segs[l_segno].numnewpasses;
                    if (n > 0) {
                        ++l_segno;

                        if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                            opj_bio_destroy(l_bio);
                            return OPJ_FALSE;
                        }
                    }
                } while (n > 0);

            ++l_cblk;
        }
    }

    if (!opj_bio_inalign(l_bio)) {
        opj_bio_destroy(l_bio);
        return OPJ_FALSE;
    }

    l_header_data += opj_bio_numbytes(l_bio);
    opj_bio_destroy(l_bio);

    /* EPH markers */
    if (p_tcp->csty & J2K_CP_CSTY_EPH) {
        if ((*l_modified_length_ptr - (OPJ_UINT32)(l_header_data -
                *l_header_data_start)) < 2U) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Not enough space for expected EPH marker\n");
        } else if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
            opj_event_msg(p_manager, EVT_WARNING, "Expected EPH marker\n");
        } else {
            l_header_data += 2;
        }
    }

    l_header_length = (OPJ_UINT32)(l_header_data - *l_header_data_start);
    JAS_FPRINTF(stderr, "hdrlen=%d \n", l_header_length);
    JAS_FPRINTF(stderr, "packet body\n");
    *l_modified_length_ptr -= l_header_length;
    *l_header_data_start += l_header_length;

    /* << INDEX */
    /* End of packet header position. Currently only represents the distance to start of packet
     Will be updated later by incrementing with packet start value */
    if (p_pack_info) {
        p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
    }
    /* INDEX >> */

    *p_is_data_present = OPJ_TRUE;
    *p_data_read = (OPJ_UINT32)(l_current_data - p_src_data);

    return OPJ_TRUE;
}